

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.cpp
# Opt level: O1

double __thiscall
ProblemFireFightingFactored::ComputeTransitionProb
          (ProblemFireFightingFactored *this,Index y,Index yVal,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Xs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *As,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys)

{
  pointer pSVar1;
  uint uVar2;
  Index *pIVar3;
  pointer puVar4;
  long lVar5;
  E *this_00;
  undefined8 *puVar6;
  long *plVar7;
  long *plVar8;
  ulong uVar9;
  Index IVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  long *local_90;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  if (*(ulong *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710 <= (ulong)y) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"position sfac transition probs NYI");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  pSVar1 = (this->super_FactoredDecPOMDPDiscrete).
           super_MultiAgentDecisionProcessDiscreteFactoredStates._m_2dbn._m_XSoI_Y.
           super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
           _M_start + y;
  pIVar3 = *(Index **)
            &(pSVar1->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl;
  if (*pIVar3 == y) {
    uVar13 = 0;
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    do {
      uVar13 = (uint)uVar9;
      if ((ulong)((long)*(pointer *)
                         ((long)&(pSVar1->super_SDT).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + 8) - (long)pIVar3 >> 2) <= uVar9) break;
      uVar13 = uVar13 + 1;
      uVar9 = (ulong)uVar13;
    } while (pIVar3[uVar9] != y);
  }
  if ((long)*(pointer *)
             ((long)&(pSVar1->super_SDT).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) -
      (long)pIVar3 >> 2 == uVar9) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"did not find this house (hI=","");
    StringTools::Append(&local_50,&local_70,y);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar7;
    plVar8 = plVar7 + 2;
    if (local_90 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar7[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
    }
    lVar5 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    *puVar6 = &PTR__E_0059bd80;
    puVar6[1] = puVar6 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar6 + 1),local_90,lVar5 + (long)local_90);
    __cxa_throw(puVar6,&E::typeinfo,E::~E);
  }
  puVar4 = (Xs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(Xs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <= uVar9) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  uVar2 = puVar4[uVar9];
  uVar9 = (ulong)uVar2;
  lVar5 = (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                 super_MultiAgentDecisionProcess + 800))(this,As,y);
  puVar4 = (Xs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)(Xs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar4;
  if (lVar11 == 0) {
    bVar14 = false;
  }
  else {
    uVar12 = 0;
    bVar14 = false;
    do {
      if ((uVar13 != (uint)uVar12) && (puVar4[uVar12] != 0)) {
        bVar14 = true;
      }
      uVar12 = uVar12 + 1;
    } while ((uVar12 & 0xffffffff) < (ulong)(lVar11 >> 2));
  }
  uVar12 = this->_m_nrFireLevels - 1;
  if (uVar9 + 1 <= uVar12) {
    uVar12 = uVar9 + 1;
  }
  IVar10 = uVar2 - 1;
  if (uVar2 == 0) {
    IVar10 = 0;
  }
  if (lVar5 == 0) {
    if (bVar14) {
      dVar15 = (double)((ulong)(uVar2 == yVal) * 0x3fc999999999999a);
      bVar14 = (Index)uVar12 == yVal;
      dVar16 = dVar15 + 0.8;
LAB_003ea744:
      return (double)((ulong)bVar14 * (long)dVar16 + (ulong)!bVar14 * (long)dVar15);
    }
    if (uVar9 != 0) {
      dVar15 = (double)((ulong)(uVar2 == yVal) * 0x3fe3333333333333);
      bVar14 = (Index)uVar12 == yVal;
      dVar16 = dVar15 + 0.4;
      goto LAB_003ea744;
    }
  }
  else if (lVar5 == 1) {
    if (bVar14) {
      dVar15 = (double)((ulong)(uVar2 == yVal) * 0x3fd999999999999a);
      bVar14 = IVar10 == yVal;
      dVar16 = dVar15 + 0.6;
      goto LAB_003ea744;
    }
    if (uVar9 != 0) {
      bVar14 = IVar10 == yVal;
      goto LAB_003ea752;
    }
  }
  bVar14 = yVal == 0;
LAB_003ea752:
  return (double)((ulong)bVar14 * 0x3ff0000000000000);
}

Assistant:

double ProblemFireFightingFactored::ComputeTransitionProb(
            Index y,
            Index yVal,
            const std::vector< Index>& Xs,
            const std::vector< Index>& As,
            const std::vector< Index>& Ys
        ) const
{
    if(y >= _m_nrHouses)
        throw E("position sfac transition probs NYI");

    //this computes the probability P( nextLevel | ...) for hI
    Index hI = y;

    const Scope& XSoI = GetXSoI_Y(y);
    Index Index_of_hI_within_scope = 0;
    while(XSoI[Index_of_hI_within_scope] != hI &&
            Index_of_hI_within_scope < XSoI.size() )
        Index_of_hI_within_scope++;

    if(Index_of_hI_within_scope == XSoI.size())
        throw E( StringTools::Append("did not find this house (hI=",hI) +
                " in its own scope of influence XSoI)" );

    Index curLevel = Xs.at(Index_of_hI_within_scope);
    Index nextLevel = yVal;
    size_t nrAgentsAtLocation=GetNrAgentsAtHouse(As,hI);

#if 0 && DEBUG_CTM
    cout << "hI="<<hI<<" #agents="<<nrAgentsAtLocation << " ";
#endif
    bool neighborIsBurning = false;
    for(Index xI=0; xI < Xs.size(); xI++)
    {
        if(xI==Index_of_hI_within_scope)
            continue; //xI points not to a neighbor, but to this (hI) house
        if(Xs.at(xI) > 0)
            neighborIsBurning = true;
    }
    //bool neighborIsBurning = isNeighborBurning(s1, hI);

    Index sameLevel = curLevel;
    Index higherLevel = min((size_t)sameLevel+1, _m_nrFireLevels-1);
    Index lowerLevel = (curLevel==0) ? 0 : (curLevel-1);
    double p2=0.0;// the prob. factor of ThisHouseFirelevel;
    switch(nrAgentsAtLocation)
    {
        case(0): 
        {
            //this is kind of strange: when a house is not burning, but
            //its neigbhor is, it will increase its FL with p=0.8
            //but when it is already burning (and its neighbor is not), it 
            //increase with p=0.4...

            //fire is likely to increase
            if(neighborIsBurning)
            {
                if(nextLevel == sameLevel)
                    p2+=0.2;
                if(nextLevel == higherLevel)
                    p2+=0.8;
            }
            else if (curLevel == 0) //fire won't get ignited
            {
                if(0 == nextLevel)
                    p2=1.0;
                else //not possible so we can quit...
                    p2=0.0;
            }
            else //normal burning house
            {
                if(nextLevel == sameLevel)
                    p2+=0.6;
                if(nextLevel == higherLevel)
                    p2+=0.4;
            }
            break;
        }
        case(1): 
        {
            //fire is likely to decrease
            if(neighborIsBurning)
            {
                if(nextLevel == sameLevel)
                    p2+=0.4;
                if(nextLevel == lowerLevel) 
                    p2+=0.6; //.6 prob of extuinguishing 1 fl
            }
            else if (curLevel == 0) //fire won't get ignited
            {
                if(0 == nextLevel)
                    p2=1.0;
                else //not possible so we can quit...
                    p2=0.0;
            }
            else //normal burning house
            {
                if(nextLevel == sameLevel)
                    p2+=0.0;
                if(nextLevel == lowerLevel)
                    p2+=1.0;
            }
            break;
        }
        default: 
        {
#if 1
            //more than 1 agent: fire is extinguished
            if(0 == nextLevel)
                p2=1.0;
            else //not possible so we can quit...
                p2=0.0;
#else // made it depend on multipleAgentExtinguishProb
            if(0 == nextLevel)
                p2+=(GetMultipleAgentExtinguishProb());
            if(nextLevel == lowerLevel)
                p2+=(1-GetMultipleAgentExtinguishProb());
#endif
        }

        
    }
    return(p2);
}